

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLoggerMgr::flushRawStack(SimpleLoggerMgr *this,RawStackInfo *stack_info)

{
  ofstream *poVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  pointer ppvVar4;
  long lVar5;
  char cVar6;
  ostream *poVar7;
  pointer ppvVar8;
  
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 != '\0') {
    poVar1 = &this->crashDumpFile;
    poVar7 = std::operator<<((ostream *)poVar1,"Thread ");
    pp_Var2 = poVar7->_vptr_basic_ostream;
    p_Var3 = pp_Var2[-3];
    *(uint *)(&poVar7->field_0x18 + (long)p_Var3) =
         *(uint *)(&poVar7->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar7->field_0x10 + (long)pp_Var2[-3]) = 4;
    poVar7 = std::operator<<(poVar7,0x30);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar7 = std::operator<<(poVar7," ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::endl<char,std::char_traits<char>>(poVar7);
    if (stack_info->crashOrigin == true) {
      poVar7 = std::operator<<((ostream *)poVar1,"(crashed here)");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    ppvVar4 = (stack_info->stackPtrs).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppvVar8 = (stack_info->stackPtrs).super__Vector_base<void_*,_std::allocator<void_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppvVar8 != ppvVar4;
        ppvVar8 = ppvVar8 + 1) {
      lVar5 = *(long *)(*(long *)&this->crashDumpFile + -0x18);
      *(uint *)(&this->field_0x240 + lVar5) = *(uint *)(&this->field_0x240 + lVar5) & 0xffffffb5 | 8
      ;
      poVar7 = std::ostream::_M_insert<void_const*>(poVar1);
      *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    return;
  }
  return;
}

Assistant:

void SimpleLoggerMgr::flushRawStack(RawStackInfo& stack_info) {
    if (!crashDumpFile.is_open()) return;

    crashDumpFile << "Thread " << std::hex << std::setw(4) << std::setfill('0')
                  << stack_info.tidHash << std::dec
                  << " " << stack_info.kernelTid << std::endl;
    if (stack_info.crashOrigin) {
        crashDumpFile << "(crashed here)" << std::endl;
    }
    for (void* stack_ptr: stack_info.stackPtrs) {
        crashDumpFile << std::hex << stack_ptr << std::dec << std::endl;
    }
    crashDumpFile << std::endl;
}